

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_dwt_decode_h_func(void *user_data,opj_tls_t *tls)

{
  opj_dwd_decode_h_job_t *job;
  OPJ_UINT32 j;
  opj_tls_t *tls_local;
  void *user_data_local;
  
  for (job._4_4_ = *(uint *)((long)user_data + 0x28); job._4_4_ < *(uint *)((long)user_data + 0x2c);
      job._4_4_ = job._4_4_ + 1) {
    opj_idwt53_h((opj_dwt_t *)user_data,
                 (OPJ_INT32 *)
                 (*(long *)((long)user_data + 0x20) +
                 (ulong)(job._4_4_ * *(int *)((long)user_data + 0x1c)) * 4));
  }
  opj_aligned_free(*user_data);
  opj_free(user_data);
  return;
}

Assistant:

static void opj_dwt_decode_h_func(void* user_data, opj_tls_t* tls)
{
    OPJ_UINT32 j;
    opj_dwd_decode_h_job_t* job;
    (void)tls;

    job = (opj_dwd_decode_h_job_t*)user_data;
    for (j = job->min_j; j < job->max_j; j++) {
        opj_idwt53_h(&job->h, &job->tiledp[j * job->w]);
    }

    opj_aligned_free(job->h.mem);
    opj_free(job);
}